

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processing(CScanner *this,char c)

{
  char c_local;
  CScanner *this_local;
  
  switch(this->state) {
  case S_Initial:
    processingInitial(this,c);
    break;
  case S_Blank:
    processingBlank(this,c);
    break;
  case S_Symbol:
    processingSymbol(this,c);
    break;
  case S_Label:
    processingLabel(this,c);
    break;
  case S_Number:
    processingNumber(this,c);
    break;
  case S_Word:
    processingWord(this,c);
    break;
  case S_BeginOfQualifier:
    processingBeginOfQualifier(this,c);
    break;
  case S_Qualifier:
    processingQualifier(this,c);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x209,"void Refal2::CScanner::processing(char)");
  }
  return;
}

Assistant:

void CScanner::processing( char c )
{
	switch( state )	{
		case S_Initial:
			processingInitial( c );
			break;
		case S_Blank:
			processingBlank( c );
			break;
		case S_Symbol:
			processingSymbol( c );
			break;
		case S_Label:
			processingLabel( c );
			break;
		case S_Number:
			processingNumber( c );
			break;
		case S_Word:
			processingWord( c );
			break;
		case S_BeginOfQualifier:
			processingBeginOfQualifier( c );
			break;
		case S_Qualifier:
			processingQualifier( c );
			break;
		default:
			assert( false );
			break;
	}
}